

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  double dVar1;
  float z_1;
  float z;
  stbi_uc *output;
  int n;
  int k;
  int i;
  float local_38;
  float local_34;
  uint local_28;
  int local_24;
  int local_20;
  stbi_uc *local_8;
  
  local_8 = (stbi_uc *)stbi__malloc(0x11526b);
  if (local_8 == (stbi_uc *)0x0) {
    free(in_RDI);
    stbi__err("outofmem");
    local_8 = (stbi_uc *)0x0;
  }
  else {
    local_28 = in_ECX;
    if ((in_ECX & 1) == 0) {
      local_28 = in_ECX - 1;
    }
    for (local_20 = 0; local_20 < in_ESI * in_EDX; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < (int)local_28; local_24 = local_24 + 1) {
        dVar1 = std::pow((double)(ulong)(uint)(*(float *)((long)in_RDI +
                                                         (long)(int)(local_20 * in_ECX + local_24) *
                                                         4) * stbi__h2l_scale_i),
                         (double)(ulong)(uint)stbi__h2l_gamma_i);
        local_34 = SUB84(dVar1,0) * 255.0 + 0.5;
        if (local_34 < 0.0) {
          local_34 = 0.0;
        }
        if (255.0 < local_34) {
          local_34 = 255.0;
        }
        local_8[(int)(local_20 * in_ECX + local_24)] = (stbi_uc)(int)local_34;
      }
      if (local_24 < (int)in_ECX) {
        local_38 = *(float *)((long)in_RDI + (long)(int)(local_20 * in_ECX + local_24) * 4) * 255.0
                   + 0.5;
        if (local_38 < 0.0) {
          local_38 = 0.0;
        }
        if (255.0 < local_38) {
          local_38 = 255.0;
        }
        local_8[(int)(local_20 * in_ECX + local_24)] = (stbi_uc)(int)local_38;
      }
    }
    free(in_RDI);
  }
  return local_8;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) stbi__malloc(x * y * comp);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}